

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

void gflags::ShutDownCommandLineFlags(void)

{
  _Rb_tree_node_base *p_Var1;
  CommandLineFlag *this;
  void *pvVar2;
  _Rb_tree_node_base *p_Var3;
  _Link_type in_RSI;
  
  pvVar2 = (anonymous_namespace)::FlagRegistry::global_registry_;
  if ((anonymous_namespace)::FlagRegistry::global_registry_ != (void *)0x0) {
    p_Var1 = (_Rb_tree_node_base *)((long)(anonymous_namespace)::FlagRegistry::global_registry_ + 8)
    ;
    for (p_Var3 = *(_Rb_tree_node_base **)
                   ((long)(anonymous_namespace)::FlagRegistry::global_registry_ + 0x18);
        p_Var3 != p_Var1; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      this = (CommandLineFlag *)p_Var3[1]._M_parent;
      if (this != (CommandLineFlag *)0x0) {
        anon_unknown_2::CommandLineFlag::~CommandLineFlag(this);
        operator_delete(this);
      }
    }
    if (*(int *)((long)pvVar2 + 0x60) != 0) {
      __assert_fail("mutex_ == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                    ,0xdd,"gflags_mutex_namespace::Mutex::~Mutex()");
    }
    std::
    _Rb_tree<const_void_*,_std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
    ::_M_erase(*(_Rb_tree<const_void_*,_std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
                 **)((long)pvVar2 + 0x40),in_RSI);
    std::
    _Rb_tree<const_char_*,_std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>,_gflags::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
    ::_M_erase(*(_Rb_tree<const_char_*,_std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>,_gflags::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
                 **)((long)pvVar2 + 0x10),(_Link_type)in_RSI);
    operator_delete(pvVar2);
  }
  (anonymous_namespace)::FlagRegistry::global_registry_ = (void *)0x0;
  return;
}

Assistant:

static void DeleteGlobalRegistry() {
    delete global_registry_;
    global_registry_ = NULL;
  }